

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O2

void __thiscall AnalyserUnits_powerValues_Test::TestBody(AnalyserUnits_powerValues_Test *this)

{
  long lVar1;
  char *pcVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_896;
  allocator_type local_9d8;
  allocator<char> local_9d7;
  allocator<char> local_9d6;
  allocator<char> local_9d5;
  allocator<char> local_9d4;
  allocator<char> local_9d3;
  allocator<char> local_9d2;
  allocator<char> local_9d1;
  allocator<char> local_9d0;
  allocator<char> local_9cf;
  allocator<char> local_9ce;
  allocator<char> local_9cd;
  allocator<char> local_9cc;
  allocator<char> local_9cb;
  allocator<char> local_9ca;
  allocator<char> local_9c9;
  allocator<char> local_9c8;
  allocator<char> local_9c7;
  allocator<char> local_9c6;
  allocator<char> local_9c5;
  allocator<char> local_9c4;
  allocator<char> local_9c3;
  allocator<char> local_9c2;
  allocator<char> local_9c1;
  allocator<char> local_9c0;
  allocator<char> local_9bf;
  allocator<char> local_9be;
  allocator<char> local_9bd;
  allocator<char> local_9bc;
  allocator<char> local_9bb;
  allocator<char> local_9ba;
  allocator<char> local_9b9;
  allocator<char> local_9b8;
  allocator<char> local_9b7;
  allocator<char> local_9b6;
  allocator<char> local_9b5;
  allocator<char> local_9b4;
  allocator<char> local_9b3;
  allocator<char> local_9b2;
  allocator<char> local_9b1;
  allocator<char> local_9b0;
  allocator<char> local_9af;
  allocator<char> local_9ae;
  allocator<char> local_9ad;
  allocator<char> local_9ac;
  allocator<char> local_9ab;
  allocator<char> local_9aa;
  allocator<char> local_9a9;
  allocator<char> local_9a8;
  allocator<char> local_9a7;
  allocator<char> local_9a6;
  allocator<char> local_9a5;
  allocator<char> local_9a4;
  allocator<char> local_9a3;
  allocator<char> local_9a2;
  allocator<char> local_9a1;
  allocator<char> local_9a0;
  allocator<char> local_99f;
  allocator<char> local_99e;
  allocator<char> local_99d;
  allocator<char> local_99c;
  allocator<char> local_99b;
  allocator<char> local_99a;
  allocator<char> local_999;
  allocator<char> local_998;
  allocator<char> local_997;
  allocator<char> local_996;
  allocator<char> local_995;
  allocator<char> local_994;
  allocator<char> local_993;
  allocator<char> local_992;
  allocator<char> local_991;
  unsigned_long local_990;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_988;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  ModelPtr model;
  ParserPtr parser;
  AnalyserPtr analyser;
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedIssues,"analyser/units/power_values.cellml",
             (allocator<char> *)&local_990);
  fileContents((string *)&analyser);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::~string((string *)&expectedIssues);
  expectedIssues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_990 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&analyser,"size_t(0)","parser->issueCount()",
             (unsigned_long *)&expectedIssues,&local_990);
  if ((char)analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&expectedIssues);
    if (analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)analyser.
                         super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_990,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
               ,0x32e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_990,(Message *)&expectedIssues);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_990);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&expectedIssues);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,
             "The units in \'eqnEq = pow(x, 3.0 == 5.0)\' in component \'my_component\' are not equivalent. \'eqnEq\' is in \'second\' while \'pow(x, 3.0 == 5.0)\' is \'dimensionless\'."
             ,(allocator<char> *)&local_990);
  std::__cxx11::string::string<std::allocator<char>>
            (local_920,
             "The units in \'eqnGt = pow(x, 3.0 > 5.0)\' in component \'my_component\' are not equivalent. \'eqnGt\' is in \'second\' while \'pow(x, 3.0 > 5.0)\' is \'dimensionless\'."
             ,(allocator<char> *)&gtest_trace_896);
  std::__cxx11::string::string<std::allocator<char>>
            (local_900,
             "The units in \'eqnGeq = pow(x, 3.0 >= 5.0)\' in component \'my_component\' are not equivalent. \'eqnGeq\' is in \'second\' while \'pow(x, 3.0 >= 5.0)\' is \'dimensionless\'."
             ,&local_991);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8e0,
             "The units in \'eqnAnd2 = pow(x, !3.0 && 5.0)\' in component \'my_component\' are not equivalent. \'eqnAnd2\' is in \'second\' while \'pow(x, !3.0 && 5.0)\' is \'dimensionless\'."
             ,&local_992);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8c0,
             "The units in \'eqnAnd3 = pow(x, 3.0 && !5.0)\' in component \'my_component\' are not equivalent. \'eqnAnd3\' is in \'second\' while \'pow(x, 3.0 && !5.0)\' is \'dimensionless\'."
             ,&local_993);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8a0,
             "The units in \'eqnOr3 = pow(x, !3.0 || !5.0)\' in component \'my_component\' are not equivalent. \'eqnOr3\' is in \'second\' while \'pow(x, !3.0 || !5.0)\' is \'dimensionless\'."
             ,&local_994);
  std::__cxx11::string::string<std::allocator<char>>
            (local_880,
             "The units in \'eqnXor = pow(x, xor(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnXor\' is in \'second\' while \'pow(x, xor(3.0, 5.0))\' is \'dimensionless\'."
             ,&local_995);
  std::__cxx11::string::string<std::allocator<char>>
            (local_860,
             "The units in \'eqnNot = pow(x, !3.0)\' in component \'my_component\' are not equivalent. \'eqnNot\' is in \'second\' while \'pow(x, !3.0)\' is \'dimensionless\'."
             ,&local_996);
  std::__cxx11::string::string<std::allocator<char>>
            (local_840,
             "The units in \'eqnPlus = pow(x, 3.0)\' in component \'my_component\' are not equivalent. \'eqnPlus\' is in \'second\' while \'pow(x, 3.0)\' is in \'second^3\'."
             ,&local_997);
  std::__cxx11::string::string<std::allocator<char>>
            (local_820,
             "The units in \'eqnPlus2 = pow(x, 3.0+5.0)\' in component \'my_component\' are not equivalent. \'eqnPlus2\' is in \'second\' while \'pow(x, 3.0+5.0)\' is in \'second^8\'."
             ,&local_998);
  std::__cxx11::string::string<std::allocator<char>>
            (local_800,
             "The units in \'eqnMinus = pow(x, -3.0)\' in component \'my_component\' are not equivalent. \'eqnMinus\' is in \'second\' while \'pow(x, -3.0)\' is in \'second^-3\'."
             ,&local_999);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7e0,
             "The units in \'eqnMinus2 = pow(x, 3.0-5.0)\' in component \'my_component\' are not equivalent. \'eqnMinus2\' is in \'second\' while \'pow(x, 3.0-5.0)\' is in \'second^-2\'."
             ,&local_99a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7c0,
             "The units in \'eqnTimes = pow(x, 3.0*5.0)\' in component \'my_component\' are not equivalent. \'eqnTimes\' is in \'second\' while \'pow(x, 3.0*5.0)\' is in \'second^15\'."
             ,&local_99b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7a0,
             "The units in \'eqnDivide = pow(x, 3.0/5.0)\' in component \'my_component\' are not equivalent. \'eqnDivide\' is in \'second\' while \'pow(x, 3.0/5.0)\' is in \'second^0.6\'."
             ,&local_99c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_780,
             "The units in \'eqnPower = pow(x, pow(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnPower\' is in \'second\' while \'pow(x, pow(3.0, 5.0))\' is in \'second^243\'."
             ,&local_99d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_760,
             "The units in \'eqnRoot = pow(x, pow(3.0, 1.0/5.0))\' in component \'my_component\' are not equivalent. \'eqnRoot\' is in \'second\' while \'pow(x, pow(3.0, 1.0/5.0))\' is in \'second^1.24573\'."
             ,&local_99e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_740,
             "The units in \'eqnRoot2 = pow(x, sqrt(3.0))\' in component \'my_component\' are not equivalent. \'eqnRoot2\' is in \'second\' while \'pow(x, sqrt(3.0))\' is in \'second^1.73205\'."
             ,&local_99f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_720,
             "The units in \'eqnAbs = pow(x, abs(-3.0))\' in component \'my_component\' are not equivalent. \'eqnAbs\' is in \'second\' while \'pow(x, abs(-3.0))\' is in \'second^3\'."
             ,&local_9a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_700,
             "The units in \'eqnExp = pow(x, exp(3.0))\' in component \'my_component\' are not equivalent. \'eqnExp\' is in \'second\' while \'pow(x, exp(3.0))\' is in \'second^20.0855\'."
             ,&local_9a1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e0,
             "The units in \'eqnLn = pow(x, ln(3.0))\' in component \'my_component\' are not equivalent. \'eqnLn\' is in \'second\' while \'pow(x, ln(3.0))\' is in \'second^1.09861\'."
             ,&local_9a2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6c0,
             "The units in \'eqnLog = pow(x, log(3.0))\' in component \'my_component\' are not equivalent. \'eqnLog\' is in \'second\' while \'pow(x, log(3.0))\' is in \'second^0.477121\'."
             ,&local_9a3);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6a0,
             "The units in \'eqnLog2 = pow(x, ln(3.0)/ln(2.0))\' in component \'my_component\' are not equivalent. \'eqnLog2\' is in \'second\' while \'pow(x, ln(3.0)/ln(2.0))\' is in \'second^1.58496\'."
             ,&local_9a4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_680,
             "The units in \'eqnLog10 = pow(x, log(3.0))\' in component \'my_component\' are not equivalent. \'eqnLog10\' is in \'second\' while \'pow(x, log(3.0))\' is in \'second^0.477121\'."
             ,&local_9a5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_660,
             "The units in \'eqnCeiling = pow(x, ceil(3.21))\' in component \'my_component\' are not equivalent. \'eqnCeiling\' is in \'second\' while \'pow(x, ceil(3.21))\' is in \'second^4\'."
             ,&local_9a6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_640,
             "The units in \'eqnFloor = pow(x, floor(3.21))\' in component \'my_component\' are not equivalent. \'eqnFloor\' is in \'second\' while \'pow(x, floor(3.21))\' is in \'second^3\'."
             ,&local_9a7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_620,
             "The units in \'eqnMin = pow(x, min(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnMin\' is in \'second\' while \'pow(x, min(3.0, 5.0))\' is in \'second^3\'."
             ,&local_9a8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_600,
             "The units in \'eqnMin2 = pow(x, min(5.0, 3.0))\' in component \'my_component\' are not equivalent. \'eqnMin2\' is in \'second\' while \'pow(x, min(5.0, 3.0))\' is in \'second^3\'."
             ,&local_9a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5e0,
             "The units in \'eqnMax = pow(x, max(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnMax\' is in \'second\' while \'pow(x, max(3.0, 5.0))\' is in \'second^5\'."
             ,&local_9aa);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5c0,
             "The units in \'eqnMax2 = pow(x, max(5.0, 3.0))\' in component \'my_component\' are not equivalent. \'eqnMax2\' is in \'second\' while \'pow(x, max(5.0, 3.0))\' is in \'second^5\'."
             ,&local_9ab);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5a0,
             "The units in \'eqnRem = pow(x, rem(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnRem\' is in \'second\' while \'pow(x, rem(3.0, 5.0))\' is in \'second^3\'."
             ,&local_9ac);
  std::__cxx11::string::string<std::allocator<char>>
            (local_580,
             "The units in \'eqnDiff = pow(x, dx/dt)\' in component \'my_component\' may not be equivalent. \'eqnDiff\' is in \'second\' while \'dx/dt\' may result in \'pow(x, dx/dt)\' having different units."
             ,&local_9ad);
  std::__cxx11::string::string<std::allocator<char>>
            (local_560,
             "The units in \'pow(x, dx/dt) = eqnDiff2\' in component \'my_component\' may not be equivalent. \'dx/dt\' may result in \'pow(x, dx/dt)\' having different units while \'eqnDiff2\' is in \'second\'."
             ,&local_9ae);
  std::__cxx11::string::string<std::allocator<char>>
            (local_540,
             "The units in \'pow(x, dx/dt) = pow(xx, dxx/dt)\' in component \'my_component\' may not be equivalent. \'dx/dt\' may result in \'pow(x, dx/dt)\' having different units while \'dxx/dt\' may result in \'pow(xx, dxx/dt)\' having different units."
             ,&local_9af);
  std::__cxx11::string::string<std::allocator<char>>
            (local_520,
             "The units in \'eqnSin = pow(x, sin(3.0))\' in component \'my_component\' are not equivalent. \'eqnSin\' is in \'second\' while \'pow(x, sin(3.0))\' is in \'second^0.14112\'."
             ,&local_9b0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_500,
             "The units in \'eqnCos = pow(x, cos(3.0))\' in component \'my_component\' are not equivalent. \'eqnCos\' is in \'second\' while \'pow(x, cos(3.0))\' is in \'second^-0.989992\'."
             ,&local_9b1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4e0,
             "The units in \'eqnTan = pow(x, tan(3.0))\' in component \'my_component\' are not equivalent. \'eqnTan\' is in \'second\' while \'pow(x, tan(3.0))\' is in \'second^-0.142547\'."
             ,&local_9b2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4c0,
             "The units in \'eqnSec = pow(x, sec(3.0))\' in component \'my_component\' are not equivalent. \'eqnSec\' is in \'second\' while \'pow(x, sec(3.0))\' is in \'second^-1.01011\'."
             ,&local_9b3);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4a0,
             "The units in \'eqnCsc = pow(x, csc(3.0))\' in component \'my_component\' are not equivalent. \'eqnCsc\' is in \'second\' while \'pow(x, csc(3.0))\' is in \'second^7.08617\'."
             ,&local_9b4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_480,
             "The units in \'eqnCot = pow(x, cot(3.0))\' in component \'my_component\' are not equivalent. \'eqnCot\' is in \'second\' while \'pow(x, cot(3.0))\' is in \'second^-7.01525\'."
             ,&local_9b5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_460,
             "The units in \'eqnSinh = pow(x, sinh(3.0))\' in component \'my_component\' are not equivalent. \'eqnSinh\' is in \'second\' while \'pow(x, sinh(3.0))\' is in \'second^10.0179\'."
             ,&local_9b6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_440,
             "The units in \'eqnCosh = pow(x, cosh(3.0))\' in component \'my_component\' are not equivalent. \'eqnCosh\' is in \'second\' while \'pow(x, cosh(3.0))\' is in \'second^10.0677\'."
             ,&local_9b7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_420,
             "The units in \'eqnTanh = pow(x, tanh(3.0))\' in component \'my_component\' are not equivalent. \'eqnTanh\' is in \'second\' while \'pow(x, tanh(3.0))\' is in \'second^0.995055\'."
             ,&local_9b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,
             "The units in \'eqnSech = pow(x, sech(3.0))\' in component \'my_component\' are not equivalent. \'eqnSech\' is in \'second\' while \'pow(x, sech(3.0))\' is in \'second^0.0993279\'."
             ,&local_9b9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3e0,
             "The units in \'eqnCsch = pow(x, csch(3.0))\' in component \'my_component\' are not equivalent. \'eqnCsch\' is in \'second\' while \'pow(x, csch(3.0))\' is in \'second^0.0998216\'."
             ,&local_9ba);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c0,
             "The units in \'eqnCoth = pow(x, coth(3.0))\' in component \'my_component\' are not equivalent. \'eqnCoth\' is in \'second\' while \'pow(x, coth(3.0))\' is in \'second^1.00497\'."
             ,&local_9bb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a0,
             "The units in \'eqnArcsin = pow(x, arcsin(0.3))\' in component \'my_component\' are not equivalent. \'eqnArcsin\' is in \'second\' while \'pow(x, arcsin(0.3))\' is in \'second^0.304693\'."
             ,&local_9bc);
  std::__cxx11::string::string<std::allocator<char>>
            (local_380,
             "The units in \'eqnArccos = pow(x, arccos(0.3))\' in component \'my_component\' are not equivalent. \'eqnArccos\' is in \'second\' while \'pow(x, arccos(0.3))\' is in \'second^1.2661\'."
             ,&local_9bd);
  std::__cxx11::string::string<std::allocator<char>>
            (local_360,
             "The units in \'eqnArctan = pow(x, arctan(3.0))\' in component \'my_component\' are not equivalent. \'eqnArctan\' is in \'second\' while \'pow(x, arctan(3.0))\' is in \'second^1.24905\'."
             ,&local_9be);
  std::__cxx11::string::string<std::allocator<char>>
            (local_340,
             "The units in \'eqnArcsec = pow(x, arcsec(3.0))\' in component \'my_component\' are not equivalent. \'eqnArcsec\' is in \'second\' while \'pow(x, arcsec(3.0))\' is in \'second^1.23096\'."
             ,&local_9bf);
  std::__cxx11::string::string<std::allocator<char>>
            (local_320,
             "The units in \'eqnArccsc = pow(x, arccsc(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccsc\' is in \'second\' while \'pow(x, arccsc(3.0))\' is in \'second^0.339837\'."
             ,&local_9c0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_300,
             "The units in \'eqnArccot = pow(x, arccot(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccot\' is in \'second\' while \'pow(x, arccot(3.0))\' is in \'second^0.321751\'."
             ,&local_9c1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e0,
             "The units in \'eqnArcsinh = pow(x, arcsinh(3.0))\' in component \'my_component\' are not equivalent. \'eqnArcsinh\' is in \'second\' while \'pow(x, arcsinh(3.0))\' is in \'second^1.81845\'."
             ,&local_9c2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2c0,
             "The units in \'eqnArccosh = pow(x, arccosh(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccosh\' is in \'second\' while \'pow(x, arccosh(3.0))\' is in \'second^1.76275\'."
             ,&local_9c3);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a0,
             "The units in \'eqnArctanh = pow(x, arctanh(0.3))\' in component \'my_component\' are not equivalent. \'eqnArctanh\' is in \'second\' while \'pow(x, arctanh(0.3))\' is in \'second^0.30952\'."
             ,&local_9c4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_280,
             "The units in \'eqnArcsech = pow(x, arcsech(0.3))\' in component \'my_component\' are not equivalent. \'eqnArcsech\' is in \'second\' while \'pow(x, arcsech(0.3))\' is in \'second^1.87382\'."
             ,&local_9c5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_260,
             "The units in \'eqnArccsch = pow(x, arccsch(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccsch\' is in \'second\' while \'pow(x, arccsch(3.0))\' is in \'second^0.32745\'."
             ,&local_9c6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_240,
             "The units in \'eqnArccoth = pow(x, arccoth(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccoth\' is in \'second\' while \'pow(x, arccoth(3.0))\' is in \'second^0.346574\'."
             ,&local_9c7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_220,
             "The units in \'eqnPiecewise = pow(x, (y > 5.0)?3.0:7.0)\' in component \'my_component\' may not be equivalent. \'eqnPiecewise\' is in \'second\' while \'(y > 5.0)?3.0:7.0\' may result in \'pow(x, (y > 5.0)?3.0:7.0)\' having different units."
             ,&local_9c8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_200,
             "The units in \'eqnCi = pow(x, y)\' in component \'my_component\' are not equivalent. \'eqnCi\' is in \'second\' while \'pow(x, y)\' is in \'second^3\'."
             ,&local_9c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e0,
             "The units in \'eqnCi2 = pow(x, z)\' in component \'my_component\' are equivalent as long as the value of \'z\' is equal to \'1.0\'."
             ,&local_9ca);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c0,
             "The units in \'eqnCi3 = pow(x, 3.0*z)\' in component \'my_component\' are equivalent as long as the value of \'3.0*z\' is equal to \'3.0\'."
             ,&local_9cb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,
             "The units in \'eqnCi4 = pow(x, y+z)\' in component \'my_component\' are equivalent as long as the value of \'y+z\' is equal to \'4.0\'."
             ,&local_9cc);
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,
             "The units in \'eqnCi5 = pow(x, pow(y-z, y-z)+1.0)\' in component \'my_component\' are equivalent as long as the value of \'pow(y-z, y-z)+1.0\' is equal to \'5.0\'."
             ,&local_9cd);
  std::__cxx11::string::string<std::allocator<char>>
            (local_160,
             "The units in \'eqnCn = pow(x, 3.0)\' in component \'my_component\' are not equivalent. \'eqnCn\' is in \'second\' while \'pow(x, 3.0)\' is in \'second^3\'."
             ,&local_9ce);
  std::__cxx11::string::string<std::allocator<char>>
            (local_140,
             "The units in \'eqnFalse = pow(x, false)\' in component \'my_component\' are not equivalent. \'eqnFalse\' is in \'second\' while \'pow(x, false)\' is \'dimensionless\'."
             ,&local_9cf);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,
             "The units in \'eqnExponentiale = pow(x, exponentiale)\' in component \'my_component\' are not equivalent. \'eqnExponentiale\' is in \'second\' while \'pow(x, exponentiale)\' is in \'second^2.71828\'."
             ,&local_9d0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,
             "The units in \'eqnPi = pow(x, pi)\' in component \'my_component\' are not equivalent. \'eqnPi\' is in \'second\' while \'pow(x, pi)\' is in \'second^3.14159\'."
             ,&local_9d1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e0,
             "The units in \'eqnInfinity = pow(x, infinity)\' in component \'my_component\' are not equivalent. \'eqnInfinity\' is in \'second\' while \'pow(x, infinity)\' is in \'second^inf\' (i.e. \'10^nan x second^inf\')."
             ,&local_9d2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,
             "The units in \'eqnNotanumber = pow(x, notanumber)\' in component \'my_component\' are not equivalent. \'eqnNotanumber\' is in \'second\' while \'pow(x, notanumber)\' is in \'second^nan\' (i.e. \'10^nan x second^nan\')."
             ,&local_9d3);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"The type of variable \'u\' in component \'my_component\' is unknown.",
             &local_9d4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,
             "The type of variable \'eqnCoverage\' in component \'my_component\' is unknown.",
             &local_9d5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,
             "The type of variable \'eqnCoverage2\' in component \'my_component\' is unknown.",
             &local_9d6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,
             "The type of variable \'eqnCoverage3\' in component \'my_component\' is unknown.",
             &local_9d7);
  __l._M_len = 0x49;
  __l._M_array = (iterator)&analyser;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expectedIssues,__l,&local_9d8);
  lVar1 = 0x900;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel
            ((shared_ptr *)
             CONCAT71(analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._1_7_,
                      (char)analyser.
                            super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr));
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_896,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
             ,0x380,"Issue occurred here.");
  std::__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Analyser,void>
            ((__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2> *)&local_990,
             &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>);
  expectEqualIssues((vector *)&expectedIssues,(shared_ptr *)&local_990);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_988);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_896);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expectedIssues);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(AnalyserUnits, powerValues)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("analyser/units/power_values.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "The units in 'eqnEq = pow(x, 3.0 == 5.0)' in component 'my_component' are not equivalent. 'eqnEq' is in 'second' while 'pow(x, 3.0 == 5.0)' is 'dimensionless'.",
        "The units in 'eqnGt = pow(x, 3.0 > 5.0)' in component 'my_component' are not equivalent. 'eqnGt' is in 'second' while 'pow(x, 3.0 > 5.0)' is 'dimensionless'.",
        "The units in 'eqnGeq = pow(x, 3.0 >= 5.0)' in component 'my_component' are not equivalent. 'eqnGeq' is in 'second' while 'pow(x, 3.0 >= 5.0)' is 'dimensionless'.",
        "The units in 'eqnAnd2 = pow(x, !3.0 && 5.0)' in component 'my_component' are not equivalent. 'eqnAnd2' is in 'second' while 'pow(x, !3.0 && 5.0)' is 'dimensionless'.",
        "The units in 'eqnAnd3 = pow(x, 3.0 && !5.0)' in component 'my_component' are not equivalent. 'eqnAnd3' is in 'second' while 'pow(x, 3.0 && !5.0)' is 'dimensionless'.",
        "The units in 'eqnOr3 = pow(x, !3.0 || !5.0)' in component 'my_component' are not equivalent. 'eqnOr3' is in 'second' while 'pow(x, !3.0 || !5.0)' is 'dimensionless'.",
        "The units in 'eqnXor = pow(x, xor(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnXor' is in 'second' while 'pow(x, xor(3.0, 5.0))' is 'dimensionless'.",
        "The units in 'eqnNot = pow(x, !3.0)' in component 'my_component' are not equivalent. 'eqnNot' is in 'second' while 'pow(x, !3.0)' is 'dimensionless'.",
        "The units in 'eqnPlus = pow(x, 3.0)' in component 'my_component' are not equivalent. 'eqnPlus' is in 'second' while 'pow(x, 3.0)' is in 'second^3'.",
        "The units in 'eqnPlus2 = pow(x, 3.0+5.0)' in component 'my_component' are not equivalent. 'eqnPlus2' is in 'second' while 'pow(x, 3.0+5.0)' is in 'second^8'.",
        "The units in 'eqnMinus = pow(x, -3.0)' in component 'my_component' are not equivalent. 'eqnMinus' is in 'second' while 'pow(x, -3.0)' is in 'second^-3'.",
        "The units in 'eqnMinus2 = pow(x, 3.0-5.0)' in component 'my_component' are not equivalent. 'eqnMinus2' is in 'second' while 'pow(x, 3.0-5.0)' is in 'second^-2'.",
        "The units in 'eqnTimes = pow(x, 3.0*5.0)' in component 'my_component' are not equivalent. 'eqnTimes' is in 'second' while 'pow(x, 3.0*5.0)' is in 'second^15'.",
        "The units in 'eqnDivide = pow(x, 3.0/5.0)' in component 'my_component' are not equivalent. 'eqnDivide' is in 'second' while 'pow(x, 3.0/5.0)' is in 'second^0.6'.",
        "The units in 'eqnPower = pow(x, pow(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnPower' is in 'second' while 'pow(x, pow(3.0, 5.0))' is in 'second^243'.",
        "The units in 'eqnRoot = pow(x, pow(3.0, 1.0/5.0))' in component 'my_component' are not equivalent. 'eqnRoot' is in 'second' while 'pow(x, pow(3.0, 1.0/5.0))' is in 'second^1.24573'.",
        "The units in 'eqnRoot2 = pow(x, sqrt(3.0))' in component 'my_component' are not equivalent. 'eqnRoot2' is in 'second' while 'pow(x, sqrt(3.0))' is in 'second^1.73205'.",
        "The units in 'eqnAbs = pow(x, abs(-3.0))' in component 'my_component' are not equivalent. 'eqnAbs' is in 'second' while 'pow(x, abs(-3.0))' is in 'second^3'.",
        "The units in 'eqnExp = pow(x, exp(3.0))' in component 'my_component' are not equivalent. 'eqnExp' is in 'second' while 'pow(x, exp(3.0))' is in 'second^20.0855'.",
        "The units in 'eqnLn = pow(x, ln(3.0))' in component 'my_component' are not equivalent. 'eqnLn' is in 'second' while 'pow(x, ln(3.0))' is in 'second^1.09861'.",
        "The units in 'eqnLog = pow(x, log(3.0))' in component 'my_component' are not equivalent. 'eqnLog' is in 'second' while 'pow(x, log(3.0))' is in 'second^0.477121'.",
        "The units in 'eqnLog2 = pow(x, ln(3.0)/ln(2.0))' in component 'my_component' are not equivalent. 'eqnLog2' is in 'second' while 'pow(x, ln(3.0)/ln(2.0))' is in 'second^1.58496'.",
        "The units in 'eqnLog10 = pow(x, log(3.0))' in component 'my_component' are not equivalent. 'eqnLog10' is in 'second' while 'pow(x, log(3.0))' is in 'second^0.477121'.",
        "The units in 'eqnCeiling = pow(x, ceil(3.21))' in component 'my_component' are not equivalent. 'eqnCeiling' is in 'second' while 'pow(x, ceil(3.21))' is in 'second^4'.",
        "The units in 'eqnFloor = pow(x, floor(3.21))' in component 'my_component' are not equivalent. 'eqnFloor' is in 'second' while 'pow(x, floor(3.21))' is in 'second^3'.",
        "The units in 'eqnMin = pow(x, min(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnMin' is in 'second' while 'pow(x, min(3.0, 5.0))' is in 'second^3'.",
        "The units in 'eqnMin2 = pow(x, min(5.0, 3.0))' in component 'my_component' are not equivalent. 'eqnMin2' is in 'second' while 'pow(x, min(5.0, 3.0))' is in 'second^3'.",
        "The units in 'eqnMax = pow(x, max(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnMax' is in 'second' while 'pow(x, max(3.0, 5.0))' is in 'second^5'.",
        "The units in 'eqnMax2 = pow(x, max(5.0, 3.0))' in component 'my_component' are not equivalent. 'eqnMax2' is in 'second' while 'pow(x, max(5.0, 3.0))' is in 'second^5'.",
        "The units in 'eqnRem = pow(x, rem(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnRem' is in 'second' while 'pow(x, rem(3.0, 5.0))' is in 'second^3'.",
        "The units in 'eqnDiff = pow(x, dx/dt)' in component 'my_component' may not be equivalent. 'eqnDiff' is in 'second' while 'dx/dt' may result in 'pow(x, dx/dt)' having different units.",
        "The units in 'pow(x, dx/dt) = eqnDiff2' in component 'my_component' may not be equivalent. 'dx/dt' may result in 'pow(x, dx/dt)' having different units while 'eqnDiff2' is in 'second'.",
        "The units in 'pow(x, dx/dt) = pow(xx, dxx/dt)' in component 'my_component' may not be equivalent. 'dx/dt' may result in 'pow(x, dx/dt)' having different units while 'dxx/dt' may result in 'pow(xx, dxx/dt)' having different units.",
        "The units in 'eqnSin = pow(x, sin(3.0))' in component 'my_component' are not equivalent. 'eqnSin' is in 'second' while 'pow(x, sin(3.0))' is in 'second^0.14112'.",
        "The units in 'eqnCos = pow(x, cos(3.0))' in component 'my_component' are not equivalent. 'eqnCos' is in 'second' while 'pow(x, cos(3.0))' is in 'second^-0.989992'.",
        "The units in 'eqnTan = pow(x, tan(3.0))' in component 'my_component' are not equivalent. 'eqnTan' is in 'second' while 'pow(x, tan(3.0))' is in 'second^-0.142547'.",
        "The units in 'eqnSec = pow(x, sec(3.0))' in component 'my_component' are not equivalent. 'eqnSec' is in 'second' while 'pow(x, sec(3.0))' is in 'second^-1.01011'.",
        "The units in 'eqnCsc = pow(x, csc(3.0))' in component 'my_component' are not equivalent. 'eqnCsc' is in 'second' while 'pow(x, csc(3.0))' is in 'second^7.08617'.",
        "The units in 'eqnCot = pow(x, cot(3.0))' in component 'my_component' are not equivalent. 'eqnCot' is in 'second' while 'pow(x, cot(3.0))' is in 'second^-7.01525'.",
        "The units in 'eqnSinh = pow(x, sinh(3.0))' in component 'my_component' are not equivalent. 'eqnSinh' is in 'second' while 'pow(x, sinh(3.0))' is in 'second^10.0179'.",
        "The units in 'eqnCosh = pow(x, cosh(3.0))' in component 'my_component' are not equivalent. 'eqnCosh' is in 'second' while 'pow(x, cosh(3.0))' is in 'second^10.0677'.",
        "The units in 'eqnTanh = pow(x, tanh(3.0))' in component 'my_component' are not equivalent. 'eqnTanh' is in 'second' while 'pow(x, tanh(3.0))' is in 'second^0.995055'.",
        "The units in 'eqnSech = pow(x, sech(3.0))' in component 'my_component' are not equivalent. 'eqnSech' is in 'second' while 'pow(x, sech(3.0))' is in 'second^0.0993279'.",
        "The units in 'eqnCsch = pow(x, csch(3.0))' in component 'my_component' are not equivalent. 'eqnCsch' is in 'second' while 'pow(x, csch(3.0))' is in 'second^0.0998216'.",
        "The units in 'eqnCoth = pow(x, coth(3.0))' in component 'my_component' are not equivalent. 'eqnCoth' is in 'second' while 'pow(x, coth(3.0))' is in 'second^1.00497'.",
        "The units in 'eqnArcsin = pow(x, arcsin(0.3))' in component 'my_component' are not equivalent. 'eqnArcsin' is in 'second' while 'pow(x, arcsin(0.3))' is in 'second^0.304693'.",
        "The units in 'eqnArccos = pow(x, arccos(0.3))' in component 'my_component' are not equivalent. 'eqnArccos' is in 'second' while 'pow(x, arccos(0.3))' is in 'second^1.2661'.",
        "The units in 'eqnArctan = pow(x, arctan(3.0))' in component 'my_component' are not equivalent. 'eqnArctan' is in 'second' while 'pow(x, arctan(3.0))' is in 'second^1.24905'.",
        "The units in 'eqnArcsec = pow(x, arcsec(3.0))' in component 'my_component' are not equivalent. 'eqnArcsec' is in 'second' while 'pow(x, arcsec(3.0))' is in 'second^1.23096'.",
        "The units in 'eqnArccsc = pow(x, arccsc(3.0))' in component 'my_component' are not equivalent. 'eqnArccsc' is in 'second' while 'pow(x, arccsc(3.0))' is in 'second^0.339837'.",
        "The units in 'eqnArccot = pow(x, arccot(3.0))' in component 'my_component' are not equivalent. 'eqnArccot' is in 'second' while 'pow(x, arccot(3.0))' is in 'second^0.321751'.",
        "The units in 'eqnArcsinh = pow(x, arcsinh(3.0))' in component 'my_component' are not equivalent. 'eqnArcsinh' is in 'second' while 'pow(x, arcsinh(3.0))' is in 'second^1.81845'.",
        "The units in 'eqnArccosh = pow(x, arccosh(3.0))' in component 'my_component' are not equivalent. 'eqnArccosh' is in 'second' while 'pow(x, arccosh(3.0))' is in 'second^1.76275'.",
        "The units in 'eqnArctanh = pow(x, arctanh(0.3))' in component 'my_component' are not equivalent. 'eqnArctanh' is in 'second' while 'pow(x, arctanh(0.3))' is in 'second^0.30952'.",
        "The units in 'eqnArcsech = pow(x, arcsech(0.3))' in component 'my_component' are not equivalent. 'eqnArcsech' is in 'second' while 'pow(x, arcsech(0.3))' is in 'second^1.87382'.",
        "The units in 'eqnArccsch = pow(x, arccsch(3.0))' in component 'my_component' are not equivalent. 'eqnArccsch' is in 'second' while 'pow(x, arccsch(3.0))' is in 'second^0.32745'.",
        "The units in 'eqnArccoth = pow(x, arccoth(3.0))' in component 'my_component' are not equivalent. 'eqnArccoth' is in 'second' while 'pow(x, arccoth(3.0))' is in 'second^0.346574'.",
        "The units in 'eqnPiecewise = pow(x, (y > 5.0)?3.0:7.0)' in component 'my_component' may not be equivalent. 'eqnPiecewise' is in 'second' while '(y > 5.0)?3.0:7.0' may result in 'pow(x, (y > 5.0)?3.0:7.0)' having different units.",
        "The units in 'eqnCi = pow(x, y)' in component 'my_component' are not equivalent. 'eqnCi' is in 'second' while 'pow(x, y)' is in 'second^3'.",
        "The units in 'eqnCi2 = pow(x, z)' in component 'my_component' are equivalent as long as the value of 'z' is equal to '1.0'.",
        "The units in 'eqnCi3 = pow(x, 3.0*z)' in component 'my_component' are equivalent as long as the value of '3.0*z' is equal to '3.0'.",
        "The units in 'eqnCi4 = pow(x, y+z)' in component 'my_component' are equivalent as long as the value of 'y+z' is equal to '4.0'.",
        "The units in 'eqnCi5 = pow(x, pow(y-z, y-z)+1.0)' in component 'my_component' are equivalent as long as the value of 'pow(y-z, y-z)+1.0' is equal to '5.0'.",
        "The units in 'eqnCn = pow(x, 3.0)' in component 'my_component' are not equivalent. 'eqnCn' is in 'second' while 'pow(x, 3.0)' is in 'second^3'.",
        "The units in 'eqnFalse = pow(x, false)' in component 'my_component' are not equivalent. 'eqnFalse' is in 'second' while 'pow(x, false)' is 'dimensionless'.",
        "The units in 'eqnExponentiale = pow(x, exponentiale)' in component 'my_component' are not equivalent. 'eqnExponentiale' is in 'second' while 'pow(x, exponentiale)' is in 'second^2.71828'.",
        "The units in 'eqnPi = pow(x, pi)' in component 'my_component' are not equivalent. 'eqnPi' is in 'second' while 'pow(x, pi)' is in 'second^3.14159'.",
        "The units in 'eqnInfinity = pow(x, infinity)' in component 'my_component' are not equivalent. 'eqnInfinity' is in 'second' while 'pow(x, infinity)' is in 'second^inf' (i.e. '10^nan x second^inf').",
        "The units in 'eqnNotanumber = pow(x, notanumber)' in component 'my_component' are not equivalent. 'eqnNotanumber' is in 'second' while 'pow(x, notanumber)' is in 'second^nan' (i.e. '10^nan x second^nan').",
        "The type of variable 'u' in component 'my_component' is unknown.",
        "The type of variable 'eqnCoverage' in component 'my_component' is unknown.",
        "The type of variable 'eqnCoverage2' in component 'my_component' is unknown.",
        "The type of variable 'eqnCoverage3' in component 'my_component' is unknown.",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES(expectedIssues, analyser);
}